

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

void __thiscall TaskProvider::TaskProvider(TaskProvider *this,ThreadPool *pool)

{
  undefined1 auVar1 [16];
  
  (this->super_AbstractTaskProvider)._vptr_AbstractTaskProvider =
       (_func_int **)&PTR__AbstractTaskProvider_001fec98;
  (this->super_AbstractTaskProvider)._completion.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->super_AbstractTaskProvider)._completion.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_AbstractTaskProvider)._completion.super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_AbstractTaskProvider)._completion.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_AbstractTaskProvider)._completion.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  auVar1 = ZEXT416(0) << 0x40;
  (this->super_AbstractTaskProvider)._taskCount = (atomic<unsigned_long>)auVar1._0_8_;
  (this->super_AbstractTaskProvider)._givenTaskCount = (atomic<unsigned_long>)auVar1._8_8_;
  *(undefined1 (*) [16])
   ((long)&(this->super_AbstractTaskProvider)._givenTaskCount.super___atomic_base<unsigned_long>.
           _M_i + 1) = auVar1;
  std::condition_variable::condition_variable(&(this->super_AbstractTaskProvider)._waiting);
  (this->super_AbstractTaskProvider)._exceptionRaised = false;
  (this->super_AbstractTaskProvider)._vptr_AbstractTaskProvider =
       (_func_int **)&PTR__TaskProvider_001fecc0;
  this->_threadPool = pool;
  return;
}

Assistant:

TaskProvider::TaskProvider( ThreadPool * pool )
    : _threadPool ( pool )
{
}